

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.c
# Opt level: O1

int insn_defines(virtual_insn *insn)

{
  switch(insn->class_code) {
  case '\0':
  case '\x01':
  case '\x02':
  case '\x04':
  case '\a':
  case '\b':
  case '\t':
  case '\x15':
  case '\x16':
    break;
  case '\x03':
  case '\n':
  case '\v':
  case '\f':
  case '\r':
  case '\x0e':
  case '\x0f':
  case '\x10':
  case '\x11':
  case '\x12':
  case '\x13':
  case '\x17':
  case '\x18':
    return -1;
  case '\x05':
  case '\x06':
    if ((insn->insn_code & 0x10U) != 0) {
      return -1;
    }
    break;
  case '\x14':
    if ((insn->insn_code & 0xfU) == 0xb) {
      return -1;
    }
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/dill/dill/virtual.c"
                  ,0x298,"int insn_defines(virtual_insn *)");
  }
  return (insn->opnds).a3.dest;
}

Assistant:

static int
insn_defines(virtual_insn* insn)
{
    switch (insn->class_code) {
    case iclass_arith3:
    case iclass_compare:
        return insn->opnds.a3.dest;
    case iclass_arith3i:
        return insn->opnds.a3i.dest;
    case iclass_arith2:
        return insn->opnds.a2.dest;
    case iclass_convert:
        return insn->opnds.a2.dest;
    case iclass_loadstorei:
        if (insn->insn_code & 0x10) {
            /* store */
            return -1;
        } else {
            return insn->opnds.a3i.dest;
        }
    case iclass_lea:
        return insn->opnds.a3i.dest;
    case iclass_loadstore:
        if (insn->insn_code & 0x10) {
            /* store */
            return -1;
        } else {
            return insn->opnds.a3.dest;
        }
    case iclass_set:
        return insn->opnds.a3i.dest;
    case iclass_setf:
        return insn->opnds.sf.dest;
    case iclass_mov:
        return insn->opnds.a2.dest;
    case iclass_reti:
    case iclass_ret:
    case iclass_branch:
    case iclass_branchi:
    case iclass_jump_to_label:
    case iclass_jump_to_reg:
    case iclass_jump_to_imm:
    case iclass_special:
        return -1;
    case iclass_call: {
        int typ = insn->insn_code & 0xf;
        /* put the return register definition in the next bb */
        if (typ != DILL_V) {
            return insn->opnds.calli.src;
        }
        return -1;
    }
    case iclass_push:
    case iclass_pushi:
    case iclass_pushf:
    case iclass_nop:
    case iclass_mark_label:
        return -1;
    default:
        assert(0);
    }
    return -1;
}